

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_frcp_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  float32 fVar7;
  float64 fVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  float_status *status;
  long lVar14;
  bool bVar15;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_40 [2];
  
  lVar4 = (ulong)ws * 0x10 + 0x338;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar14 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar7 = float32_div_mips64(0x3f800000,
                                 *(float32 *)
                                  ((long)(env->active_fpu).fpr + lVar14 * 4 + lVar4 + -0x338),pfVar2
                                );
      *(float32 *)((long)local_40 + lVar14 * 4) = fVar7;
      bVar15 = true;
      if ((*(uint *)((long)(env->active_fpu).fpr + lVar14 * 4 + lVar4 + -0x338) & 0x7fffffff) !=
          0x7f800000) {
        iVar5 = float32_is_quiet_nan_mips64(fVar7,pfVar2);
        bVar15 = iVar5 != 0;
      }
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar13 = (uint)bVar3;
      if ((fVar7 & 0x7f800000) == 0) {
        uVar13 = uVar13 | 0x10;
      }
      if ((fVar7 & 0x7fffffff) == 0) {
        uVar13 = (uint)bVar3;
      }
      uVar6 = ieee_ex_to_mips_mips64(uVar13);
      uVar9 = (env->active_tc).msacsr;
      uVar12 = (uVar9 & 0x1000000) >> 0x18 & uVar13 >> 6;
      uVar10 = 3;
      if ((uVar9 & 0x1000000) == 0) {
        uVar10 = uVar12;
      }
      if (uVar13 < 0x80) {
        uVar10 = uVar12;
      }
      uVar10 = uVar10 | uVar6;
      uVar12 = (uint)((uVar9 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar11 = uVar12 | uVar10;
      uVar13 = uVar6 & 0xfffffffc;
      if ((uVar12 != 0 || (uVar10 & 1) != 0) || (uVar9 & 0x100) != 0) {
        uVar13 = uVar11;
      }
      if ((uVar10 & 2) == 0) {
        uVar13 = uVar11;
      }
      uVar10 = 1;
      if ((uVar13 & 0x18) != 0) {
        uVar10 = uVar13;
      }
      if (bVar15) {
        uVar10 = uVar13;
      }
      if ((uVar10 & (uVar9 >> 7 & 0x1f | 0x20)) == 0) {
        uVar13 = uVar10 << 0xc;
LAB_008d353a:
        (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar9;
      }
      else if ((uVar9 >> 0x12 & 1) == 0) {
        uVar13 = uVar10 << 0xc | uVar9;
        uVar9 = uVar9 & 0xfff80fff;
        goto LAB_008d353a;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar10) != 0) {
        fVar7 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)local_40 + lVar14 * 4) = fVar7 & 0xffffffc0 ^ 0x400000 | uVar10;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1ba7,
                    "void helper_msa_frcp_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)");
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar14 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar8 = float64_div_mips64(0x3ff0000000000000,
                                 *(float64 *)
                                  ((long)(env->active_fpu).fpr + lVar14 * 8 + lVar4 + -0x338),pfVar2
                                );
      local_40[lVar14] = fVar8;
      bVar15 = true;
      if ((*(ulong *)((long)(env->active_fpu).fpr + lVar14 * 8 + lVar4 + -0x338) &
          0x7fffffffffffffff) != 0x7ff0000000000000) {
        iVar5 = float64_is_quiet_nan_mips64(fVar8,pfVar2);
        bVar15 = iVar5 != 0;
      }
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar13 = (uint)bVar3;
      if ((fVar8 & 0x7ff0000000000000) == 0) {
        uVar13 = uVar13 | 0x10;
      }
      if ((fVar8 & 0x7fffffffffffffff) == 0) {
        uVar13 = (uint)bVar3;
      }
      uVar6 = ieee_ex_to_mips_mips64(uVar13);
      uVar9 = (env->active_tc).msacsr;
      uVar12 = (uVar9 & 0x1000000) >> 0x18 & uVar13 >> 6;
      uVar10 = 3;
      if ((uVar9 & 0x1000000) == 0) {
        uVar10 = uVar12;
      }
      if (uVar13 < 0x80) {
        uVar10 = uVar12;
      }
      uVar10 = uVar10 | uVar6;
      uVar11 = (uint)((uVar9 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar12 = uVar11 | uVar10;
      uVar13 = uVar6 & 0xfffffffc;
      if ((uVar11 != 0 || (uVar10 & 1) != 0) || (uVar9 & 0x100) != 0) {
        uVar13 = uVar12;
      }
      if ((uVar10 & 2) == 0) {
        uVar13 = uVar12;
      }
      uVar10 = 1;
      if ((uVar13 & 0x18) != 0) {
        uVar10 = uVar13;
      }
      if (bVar15) {
        uVar10 = uVar13;
      }
      if ((uVar10 & (uVar9 >> 7 & 0x1f | 0x20)) == 0) {
        uVar13 = uVar10 << 0xc;
LAB_008d33c3:
        (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar9;
      }
      else if ((uVar9 >> 0x12 & 1) == 0) {
        uVar13 = uVar10 << 0xc | uVar9;
        uVar9 = uVar9 & 0xfff80fff;
        goto LAB_008d33c3;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar10) != 0) {
        fVar8 = float64_default_nan_mips64(pfVar2);
        local_40[lVar14] = (long)(int)uVar10 | fVar8 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 == 1);
  }
  uVar13 = (env->active_tc).msacsr;
  uVar9 = uVar13 >> 7 & 0x1f | 0x20;
  if ((uVar9 & uVar13 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar9);
  }
  (env->active_tc).msacsr = (uVar13 >> 0xc & 0x1f) << 2 | uVar13;
  (env->active_fpu).fpr[wd].fd = local_40[0];
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = local_40[1];
  return;
}

Assistant:

void helper_msa_frcp_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                        uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_RECIPROCAL(pwx->w[i], pws->w[i], 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_RECIPROCAL(pwx->d[i], pws->d[i], 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}